

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_(CompilerGLSL *this,SPIRConstantOp *cop)

{
  __node_base_ptr *this_00;
  uint32_t uVar1;
  uint32_t right;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  SPIRType *pSVar8;
  CompilerError *pCVar9;
  uint *puVar10;
  SPIRType *pSVar11;
  size_t sVar12;
  long in_RDX;
  undefined1 local_630 [40];
  string local_608 [32];
  undefined1 local_5e8 [32];
  undefined1 local_5c8 [40];
  SPIRType expected;
  SPIRType *arg_type;
  string local_448 [32];
  undefined1 local_428 [40];
  string local_400 [32];
  spirv_cross local_3e0 [39];
  char local_3b9;
  undefined1 local_3b8 [8];
  SPIRType expected_type;
  string cast_op1;
  string local_248 [8];
  string cast_op0;
  allocator local_221;
  string local_220 [35];
  byte local_1fd;
  BaseType local_1fc;
  uint32_t uStack_1f8;
  bool skip_cast_if_equal_type;
  BaseType input_type;
  uint32_t bit_width;
  char local_1ca;
  allocator local_1c9;
  string local_1c8 [39];
  char local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  uint local_120;
  uint local_11c;
  uint32_t index;
  uint32_t i;
  string right_arg;
  undefined1 local_f8 [8];
  string left_arg;
  uint32_t left_components;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [40];
  string local_80 [48];
  string local_50 [8];
  string op;
  bool unary;
  bool binary;
  SPIRType *type;
  SPIRConstantOp *cop_local;
  CompilerGLSL *this_local;
  string *expr;
  
  uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)(in_RDX + 0x48));
  pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)cop,uVar6);
  bVar4 = false;
  bVar3 = false;
  ::std::__cxx11::string::string(local_50);
  bVar5 = is_legacy((CompilerGLSL *)cop);
  if ((bVar5) && (bVar5 = is_unsigned_opcode(*(Op *)(in_RDX + 0xc)), bVar5)) {
    local_a8[0x26] = '\x01';
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_80,"Unsigned integers are not supported on legacy targets.",
               (allocator *)(local_a8 + 0x27));
    CompilerError::CompilerError(pCVar9,(string *)local_80);
    local_a8[0x26] = '\0';
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uVar6 = (uint32_t)cop;
  switch(*(undefined4 *)(in_RDX + 0xc)) {
  case 0x4f:
    type_to_glsl_constructor_abi_cxx11_(this,(SPIRType *)cop);
    ::std::__cxx11::string::operator+=((string *)this,"(");
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    pSVar8 = Compiler::expression_type((Compiler *)cop,*puVar10);
    uVar2 = pSVar8->vecsize;
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_f8,uVar6,SUB41(*puVar10,0));
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)&index,uVar6,SUB41(*puVar10,0));
    for (local_11c = 2; uVar7 = local_11c,
        sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10)),
        uVar7 < (uint)sVar12; local_11c = local_11c + 1) {
      puVar10 = VectorView<unsigned_int>::operator[]
                          ((VectorView<unsigned_int> *)(in_RDX + 0x10),(ulong)local_11c);
      local_120 = *puVar10;
      if (local_120 < uVar2) {
        ::std::operator+(local_1a0,local_f8);
        ::std::operator+(local_180,(char)local_1a0);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_180);
        ::std::__cxx11::string::~string((string *)local_180);
        ::std::__cxx11::string::~string((string *)local_1a0);
      }
      else {
        ::std::operator+(local_160,(char *)&index);
        ::std::operator+(local_140,(char)local_160);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_140);
        ::std::__cxx11::string::~string((string *)local_140);
        ::std::__cxx11::string::~string((string *)local_160);
      }
      uVar7 = local_11c + 1;
      sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
      if (uVar7 < (uint)sVar12) {
        ::std::__cxx11::string::operator+=((string *)this,", ");
      }
    }
    ::std::__cxx11::string::operator+=((string *)this,")");
    ::std::__cxx11::string::~string((string *)&index);
    ::std::__cxx11::string::~string((string *)local_f8);
    goto LAB_002dda40;
  default:
    input_type._2_1_ = 1;
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&bit_width,"Unimplemented spec constant op.",
               (allocator *)((long)&input_type + 3));
    CompilerError::CompilerError(pCVar9,(string *)&bit_width);
    input_type._2_1_ = Unknown >> 0x10;
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0x51:
    local_1a1 = '\0';
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    uVar2 = *puVar10;
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    access_chain_internal_abi_cxx11_
              (this,uVar6,(uint32_t *)(ulong)uVar2,(uint32_t)puVar10,(int)sVar12 - 1,
               (AccessChainMeta *)0x1);
    local_1a1 = '\x01';
    goto LAB_002dda40;
  case 0x52:
    local_1ca = '\x01';
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1c8,"OpCompositeInsert spec constant op is not supported.",&local_1c9);
    CompilerError::CompilerError(pCVar9,(string *)local_1c8);
    local_1ca = '\0';
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case 0x71:
  case 0x72:
  case 0x73:
    type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_a8,(SPIRType *)cop);
    ::std::__cxx11::string::operator=(local_50,(string *)local_a8);
    ::std::__cxx11::string::~string((string *)local_a8);
    break;
  case 0x7e:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"-");
    break;
  case 0x80:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"+");
    break;
  case 0x82:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"-");
    break;
  case 0x84:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"*");
    break;
  case 0x86:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"/");
    break;
  case 0x87:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"/");
    break;
  case 0x89:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"%");
    break;
  case 0x8b:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"%");
    break;
  case 0xa4:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"==");
    break;
  case 0xa5:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"!=");
    break;
  case 0xa6:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"||");
    break;
  case 0xa7:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"&&");
    break;
  case 0xa8:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"!");
    break;
  case 0xa9:
    sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar12 < 3) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c8,"Not enough arguments to OpSpecConstantOp.",&local_c9)
      ;
      CompilerError::CompilerError(pCVar9,(string *)local_c8);
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),2);
    uVar1 = *puVar10;
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    right = *puVar10;
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    bVar5 = to_trivial_mix_op((CompilerGLSL *)cop,pSVar8,(string *)local_50,uVar1,right,*puVar10);
    if (!bVar5) {
      puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
      uVar6 = *puVar10;
      puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
      uVar1 = *puVar10;
      VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),2);
      to_ternary_expression_abi_cxx11_(this,(SPIRType *)cop,(uint32_t)pSVar8,uVar6,uVar1);
      goto LAB_002dda40;
    }
    break;
  case 0xaa:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"==");
    break;
  case 0xab:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"!=");
    break;
  case 0xac:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,">");
    break;
  case 0xad:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,">");
    break;
  case 0xae:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,">=");
    break;
  case 0xaf:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,">=");
    break;
  case 0xb0:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"<");
    break;
  case 0xb1:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"<");
    break;
  case 0xb2:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"<=");
    break;
  case 0xb3:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"<=");
    break;
  case 0xc2:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,">>");
    break;
  case 0xc3:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,">>");
    break;
  case 0xc4:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"<<");
    break;
  case 0xc5:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"|");
    break;
  case 0xc6:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"^");
    break;
  case 199:
    bVar4 = true;
    ::std::__cxx11::string::operator=(local_50,"&");
    break;
  case 200:
    bVar3 = true;
    ::std::__cxx11::string::operator=(local_50,"~");
  }
  uStack_1f8 = 0;
  if ((((bVar3) || (bVar4)) || (*(int *)(in_RDX + 0xc) == 0x72)) || (*(int *)(in_RDX + 0xc) == 0x71)
     ) {
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    pSVar11 = Compiler::expression_type((Compiler *)cop,*puVar10);
    uStack_1f8 = pSVar11->width;
  }
  local_1fd = opcode_is_sign_invariant(*(Op *)(in_RDX + 0xc));
  switch(*(undefined4 *)(in_RDX + 0xc)) {
  case 0x71:
  case 0x86:
  case 0x89:
  case 0xac:
  case 0xae:
  case 0xb0:
  case 0xb2:
  case 0xc2:
    local_1fc = to_unsigned_basetype(uStack_1f8);
    break;
  case 0x72:
  case 0x7e:
  case 0x87:
  case 0x8b:
  case 0xad:
  case 0xaf:
  case 0xb1:
  case 0xb3:
  case 0xc3:
    local_1fc = to_signed_basetype(uStack_1f8);
    break;
  default:
    local_1fc = *(BaseType *)&(pSVar8->super_IVariant).field_0xc;
    break;
  case 0xaa:
  case 0xab:
    local_1fc = to_signed_basetype(uStack_1f8);
  }
  if (bVar4) {
    sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar12 < 2) {
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_220,"Not enough arguments to OpSpecConstantOp.",&local_221);
      CompilerError::CompilerError(pCVar9,(string *)local_220);
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::string(local_248);
    this_00 = &expected_type.member_name_cache._M_h._M_single_bucket;
    ::std::__cxx11::string::string((string *)this_00);
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    uVar6 = *puVar10;
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),1);
    binary_op_bitcast_helper
              ((SPIRType *)local_3b8,(CompilerGLSL *)cop,(string *)local_248,(string *)this_00,
               &local_1fc,uVar6,*puVar10,(bool)(local_1fd & 1));
    if ((*(BaseType *)&(pSVar8->super_IVariant).field_0xc == local_1fc) ||
       (*(int *)&(pSVar8->super_IVariant).field_0xc == 2)) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [2])0x4f3f9c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (char (*) [2])0x4e078e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x4e078e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &expected_type.member_name_cache._M_h._M_single_bucket,(char (*) [2])0x4dff7a);
    }
    else {
      expected_type.super_IVariant._vptr_IVariant._4_4_ = local_1fc;
      local_3b9 = '\0';
      (*(cop->super_IVariant)._vptr_IVariant[0x34])(this,cop,pSVar8,local_3b8);
      ::std::__cxx11::string::operator+=((string *)this,'(');
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (local_3e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (char (*) [2])0x4e078e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x4e078e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &expected_type.member_name_cache._M_h._M_single_bucket);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_3e0);
      ::std::__cxx11::string::~string((string *)local_3e0);
      ::std::__cxx11::string::operator+=((string *)this,')');
      local_3b9 = '\x01';
    }
    SPIRType::~SPIRType((SPIRType *)local_3b8);
    ::std::__cxx11::string::~string
              ((string *)&expected_type.member_name_cache._M_h._M_single_bucket);
    ::std::__cxx11::string::~string(local_248);
  }
  else if (bVar3) {
    sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar12 == 0) {
      local_428[0x26] = '\x01';
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_400,"Not enough arguments to OpSpecConstantOp.",
                 (allocator *)(local_428 + 0x27));
      CompilerError::CompilerError(pCVar9,(string *)local_400);
      local_428[0x26] = '\0';
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_428,(SPIRType *)cop,(uint32_t)pSVar8);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::~string((string *)local_428);
  }
  else if ((*(int *)(in_RDX + 0xc) == 0x72) || (*(int *)(in_RDX + 0xc) == 0x71)) {
    sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar12 == 0) {
      arg_type._6_1_ = 1;
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_448,"Not enough arguments to OpSpecConstantOp.",
                 (allocator *)((long)&arg_type + 7));
      CompilerError::CompilerError(pCVar9,(string *)local_448);
      arg_type._6_1_ = 0;
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    expected.member_name_cache._M_h._M_single_bucket =
         (__node_base_ptr)Compiler::expression_type((Compiler *)cop,*puVar10);
    if ((((SPIRType *)expected.member_name_cache._M_h._M_single_bucket)->width < pSVar8->width) &&
       (local_1fc !=
        *(BaseType *)
         &(((SPIRType *)expected.member_name_cache._M_h._M_single_bucket)->super_IVariant).field_0xc
       )) {
      SPIRType::SPIRType((SPIRType *)(local_5c8 + 0x20),
                         (SPIRType *)expected.member_name_cache._M_h._M_single_bucket);
      expected.super_IVariant._vptr_IVariant._4_4_ = local_1fc;
      VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
      bitcast_glsl_abi_cxx11_((CompilerGLSL *)local_5c8,(SPIRType *)cop,(int)local_5c8 + 0x20);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x4f3f9c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                 (char (*) [2])0x4dff7a);
      ::std::__cxx11::string::~string((string *)local_5c8);
      SPIRType::~SPIRType((SPIRType *)(local_5c8 + 0x20));
    }
    else {
      puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
      to_expression_abi_cxx11_((CompilerGLSL *)local_5e8,uVar6,SUB41(*puVar10,0));
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (char (*) [2])0x4f3f9c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e8,
                 (char (*) [2])0x4dff7a);
      ::std::__cxx11::string::~string((string *)local_5e8);
    }
  }
  else {
    sVar12 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(in_RDX + 0x10));
    if (sVar12 == 0) {
      local_630[0x26] = 1;
      pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_608,"Not enough arguments to OpSpecConstantOp.",
                 (allocator *)(local_630 + 0x27));
      CompilerError::CompilerError(pCVar9,(string *)local_608);
      local_630[0x26] = 0;
      __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar10 = VectorView<unsigned_int>::operator[]((VectorView<unsigned_int> *)(in_RDX + 0x10),0);
    to_expression_abi_cxx11_((CompilerGLSL *)local_630,uVar6,SUB41(*puVar10,0));
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [2])0x4f3f9c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
               (char (*) [2])0x4dff7a);
    ::std::__cxx11::string::~string((string *)local_630);
  }
LAB_002dda40:
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index >= left_components)
				expr += right_arg + "." + "xyzw"[index - left_components];
			else
				expr += left_arg + "." + "xyzw"[index];

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
		SPIRV_CROSS_THROW("OpCompositeInsert spec constant op is not supported.");

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}